

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSOSerializer.cpp
# Opt level: O0

bool Diligent::PSOSerializer<(Diligent::SerializerMode)0>::SerializeCreateInfo
               (Serializer<(Diligent::SerializerMode)0> *Ser,
               ConstQual<PipelineStateCreateInfo> *CreateInfo,ConstQual<TPRSNames> *PRSNames,
               DynamicLinearAllocator *Allocator)

{
  uint uVar1;
  ConstQual<PipelineStateCreateInfo> *this;
  bool bVar2;
  uint *puVar3;
  reference Arg0;
  uint local_44;
  uint local_40;
  Uint32 i;
  PipelineResourceLayoutDesc *ResourceLayout;
  DynamicLinearAllocator *Allocator_local;
  ConstQual<TPRSNames> *PRSNames_local;
  ConstQual<PipelineStateCreateInfo> *CreateInfo_local;
  Serializer<(Diligent::SerializerMode)0> *Ser_local;
  
  ResourceLayout = (PipelineResourceLayoutDesc *)Allocator;
  Allocator_local = (DynamicLinearAllocator *)PRSNames;
  PRSNames_local = (ConstQual<TPRSNames> *)CreateInfo;
  CreateInfo_local = (ConstQual<PipelineStateCreateInfo> *)Ser;
  bVar2 = Serializer<(Diligent::SerializerMode)0>::operator()
                    (Ser,&(CreateInfo->PSODesc).PipelineType);
  if (bVar2) {
    bVar2 = Serializer<(Diligent::SerializerMode)0>::operator()
                      ((Serializer<(Diligent::SerializerMode)0> *)CreateInfo_local,
                       (uint *)((long)PRSNames_local[1]._M_elems + 4),
                       (PSO_CREATE_FLAGS *)(PRSNames_local + 1));
    if (bVar2) {
      _i = PRSNames_local->_M_elems + 3;
      bVar2 = Serializer<(Diligent::SerializerMode)0>::operator()
                        ((Serializer<(Diligent::SerializerMode)0> *)CreateInfo_local,
                         (SHADER_RESOURCE_VARIABLE_TYPE *)_i,
                         (SHADER_TYPE *)((long)PRSNames_local->_M_elems + 0x1c));
      if (bVar2) {
        bVar2 = Serializer<(Diligent::SerializerMode)0>::
                SerializeArray<Diligent::ShaderResourceVariableDesc_const*,unsigned_int,Diligent::PSOSerializer<(Diligent::SerializerMode)0>::SerializeCreateInfo(Diligent::Serializer<(Diligent::SerializerMode)0>&,Diligent::PipelineStateCreateInfo&,std::array<char_const*,8ul>&,Diligent::DynamicLinearAllocator*)::_lambda(Diligent::Serializer<(Diligent::SerializerMode)0>&,Diligent::ShaderResourceVariableDesc&)_1_>
                          ((Serializer<(Diligent::SerializerMode)0> *)CreateInfo_local,
                           ResourceLayout,_i + 2,_i + 1);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          bVar2 = Serializer<(Diligent::SerializerMode)0>::
                  SerializeArray<Diligent::ImmutableSamplerDesc_const*,unsigned_int,bool(*)(Diligent::Serializer<(Diligent::SerializerMode)0>&,Diligent::ImmutableSamplerDesc&)>
                            ((Serializer<(Diligent::SerializerMode)0> *)CreateInfo_local,
                             (DynamicLinearAllocator *)ResourceLayout,
                             (ImmutableSamplerDesc **)(_i + 4),(uint *)(_i + 3),
                             SerializeImmutableSampler<(Diligent::SerializerMode)0>);
          if (bVar2) {
            local_40 = 0;
            while( true ) {
              uVar1 = local_40;
              local_44 = 1;
              puVar3 = std::max<unsigned_int>
                                 ((uint *)((long)PRSNames_local[1]._M_elems + 4),&local_44);
              this = CreateInfo_local;
              if (*puVar3 <= uVar1) break;
              Arg0 = std::array<const_char_*,_8UL>::operator[]
                               ((array<const_char_*,_8UL> *)Allocator_local,(ulong)local_40);
              bVar2 = Serializer<(Diligent::SerializerMode)0>::operator()
                                ((Serializer<(Diligent::SerializerMode)0> *)this,Arg0);
              if (!bVar2) {
                return false;
              }
              local_40 = local_40 + 1;
            }
            Ser_local._7_1_ = true;
          }
          else {
            Ser_local._7_1_ = false;
          }
        }
        else {
          Ser_local._7_1_ = false;
        }
      }
      else {
        Ser_local._7_1_ = false;
      }
    }
    else {
      Ser_local._7_1_ = false;
    }
  }
  else {
    Ser_local._7_1_ = false;
  }
  return Ser_local._7_1_;
}

Assistant:

bool PSOSerializer<Mode>::SerializeCreateInfo(
    Serializer<Mode>&                   Ser,
    ConstQual<PipelineStateCreateInfo>& CreateInfo,
    ConstQual<TPRSNames>&               PRSNames,
    DynamicLinearAllocator*             Allocator)
{
    // Serialize PipelineStateCreateInfo
    // Serialize PipelineStateDesc
    if (!Ser(CreateInfo.PSODesc.PipelineType))
        return false;

    if (!Ser(CreateInfo.ResourceSignaturesCount,
             CreateInfo.Flags))
        return false;
    // skip SRBAllocationGranularity
    // skip ImmediateContextMask
    // skip pPSOCache

    auto& ResourceLayout = CreateInfo.PSODesc.ResourceLayout;
    if (!Ser(ResourceLayout.DefaultVariableType, ResourceLayout.DefaultVariableMergeStages))
        return false;

    if (!Ser.SerializeArray(Allocator, ResourceLayout.Variables, ResourceLayout.NumVariables,
                            [](Serializer<Mode>&                      Ser,
                               ConstQual<ShaderResourceVariableDesc>& VarDesc) //
                            {
                                return Ser(VarDesc.Name,
                                           VarDesc.ShaderStages,
                                           VarDesc.Type,
                                           VarDesc.Flags);
                            }))
        return false;

    if (!Ser.SerializeArray(Allocator, ResourceLayout.ImmutableSamplers, ResourceLayout.NumImmutableSamplers, SerializeImmutableSampler<Mode>))
        return false;

    // Instead of ppResourceSignatures
    for (Uint32 i = 0; i < std::max(CreateInfo.ResourceSignaturesCount, 1u); ++i)
    {
        if (!Ser(PRSNames[i]))
            return false;
    }

    ASSERT_SIZEOF64(ShaderResourceVariableDesc, 16, "Did you add a new member to ShaderResourceVariableDesc? Please add serialization here.");
    ASSERT_SIZEOF64(PipelineStateCreateInfo, 96, "Did you add a new member to PipelineStateCreateInfo? Please add serialization here.");

    return true;
}